

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O0

bool __thiscall
PDFUsedFont::EnumeratePaths
          (PDFUsedFont *this,IOutlineEnumerator *target,string *inText,double inFontSize)

{
  bool bVar1;
  undefined1 local_40 [8];
  UIntList glyphs;
  double inFontSize_local;
  string *inText_local;
  IOutlineEnumerator *target_local;
  PDFUsedFont *this_local;
  
  glyphs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node._M_size =
       (size_t)inFontSize;
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  GetUnicodeGlyphs(this,inText,(list<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  bVar1 = EnumeratePaths(this,target,(UIntList *)local_40,
                         (double)glyphs.
                                 super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl._M_node._M_size);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return bVar1;
}

Assistant:

bool PDFUsedFont::EnumeratePaths(IOutlineEnumerator& target, const std::string& inText,double inFontSize)
{
	UIntList glyphs;
	GetUnicodeGlyphs(inText, glyphs);
	return EnumeratePaths(target, glyphs,inFontSize);
}